

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O0

bool bssl::ssl_needs_record_splitting(SSL *ssl)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer pSVar4;
  SSL_CIPHER *cipher;
  bool local_11;
  SSL *ssl_local;
  
  iVar3 = CRYPTO_fuzzer_mode_enabled();
  local_11 = false;
  if (iVar3 == 0) {
    pSVar4 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                       (&ssl->s3->aead_write_ctx);
    bVar1 = SSLAEADContext::is_null_cipher(pSVar4);
    local_11 = false;
    if (!bVar1) {
      uVar2 = ssl_protocol_version(ssl);
      local_11 = false;
      if ((uVar2 < 0x302) && (local_11 = false, (ssl->mode & 0x100) != 0)) {
        pSVar4 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                           (&ssl->s3->aead_write_ctx);
        cipher = SSLAEADContext::cipher(pSVar4);
        iVar3 = SSL_CIPHER_is_block_cipher(cipher);
        local_11 = iVar3 != 0;
      }
    }
  }
  return local_11;
}

Assistant:

bool ssl_needs_record_splitting(const SSL *ssl) {
  return !CRYPTO_fuzzer_mode_enabled() &&
         !ssl->s3->aead_write_ctx->is_null_cipher() &&
         ssl_protocol_version(ssl) < TLS1_1_VERSION &&
         (ssl->mode & SSL_MODE_CBC_RECORD_SPLITTING) != 0 &&
         SSL_CIPHER_is_block_cipher(ssl->s3->aead_write_ctx->cipher());
}